

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainBuilder * __thiscall
kj::MainBuilder::expectOneOrMoreArgs
          (MainBuilder *this,StringPtr title,
          Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback)

{
  bool bVar1;
  Impl *pIVar2;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *pFVar3;
  Arg local_78;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback_local;
  MainBuilder *this_local;
  StringPtr title_local;
  
  pIVar2 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  f.exception._6_1_ =
       std::
       map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
       ::empty(&pIVar2->subCommands);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[50]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x173,FAILED,"impl->subCommands.empty()",
               "_kjCondition,\"cannot have sub-commands when expecting arguments\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [50])"cannot have sub-commands when expecting arguments");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  pIVar2 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  local_78.title.content.ptr = title.content.ptr;
  local_78.title.content.size_ = title.content.size_;
  pFVar3 = mv<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>(callback);
  Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Function(&local_78.callback,pFVar3);
  local_78.minCount = 1;
  local_78.maxCount = 0xffffffff;
  Vector<kj::MainBuilder::Impl::Arg>::add<kj::MainBuilder::Impl::Arg>(&pIVar2->args,&local_78);
  Impl::Arg::~Arg(&local_78);
  return this;
}

Assistant:

MainBuilder& MainBuilder::expectOneOrMoreArgs(
    StringPtr title, Function<Validity(StringPtr)> callback) {
  KJ_REQUIRE(impl->subCommands.empty(), "cannot have sub-commands when expecting arguments");
  impl->args.add(Impl::Arg { title, kj::mv(callback), 1, UINT_MAX });
  return *this;
}